

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.h
# Opt level: O3

void __thiscall
aeron::ClientConductor::SubscriptionStateDefn::SubscriptionStateDefn
          (SubscriptionStateDefn *this,string *channel,int64_t registrationId,int32_t streamId,
          longlong now,on_available_image_t *onAvailableImageHandler,
          on_unavailable_image_t *onUnavailableImageHandler)

{
  pointer pcVar1;
  
  (this->m_channel)._M_dataplus._M_p = (pointer)&(this->m_channel).field_2;
  pcVar1 = (channel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + channel->_M_string_length);
  this->m_registrationId = registrationId;
  this->m_streamId = streamId;
  this->m_timeOfRegistration = now;
  this->m_status = AWAITING_MEDIA_DRIVER;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  (this->m_errorMessage)._M_string_length = 0;
  (this->m_errorMessage).field_2._M_local_buf[0] = '\0';
  (this->m_subscriptionCache).super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_subscriptionCache).super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_subscription).super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_subscription).super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<void_(aeron::Image_&)>::function
            (&this->m_onAvailableImageHandler,onAvailableImageHandler);
  std::function<void_(aeron::Image_&)>::function
            (&this->m_onUnavailableImageHandler,onUnavailableImageHandler);
  return;
}

Assistant:

SubscriptionStateDefn(
            const std::string& channel,
            std::int64_t registrationId,
            std::int32_t streamId,
            long long now,
            const on_available_image_t &onAvailableImageHandler,
            const on_unavailable_image_t &onUnavailableImageHandler) :
            m_channel(channel),
            m_registrationId(registrationId),
            m_streamId(streamId),
            m_timeOfRegistration(now),
            m_onAvailableImageHandler(onAvailableImageHandler),
            m_onUnavailableImageHandler(onUnavailableImageHandler)
        {
        }